

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O2

XMLCh * __thiscall
xercesc_4_0::TraverseSchema::traverseNotationDecl
          (TraverseSchema *this,DOMElement *elem,XMLCh *name,XMLCh *uriStr)

{
  SchemaInfo *pSVar1;
  bool bVar2;
  int iVar3;
  uint namespaceURI;
  DOMElement *elem_00;
  XMLCh *pXVar4;
  Grammar *pGVar5;
  SchemaInfo *this_00;
  NamespaceScopeManager nsMgr;
  
  NamespaceScopeManager::NamespaceScopeManager(&nsMgr,elem,this->fSchemaInfo,this);
  iVar3 = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[5])
                    (this->fURIStringPool,uriStr);
  pSVar1 = this->fSchemaInfo;
  this_00 = pSVar1;
  if (this->fTargetNSURI == iVar3) {
LAB_0031c160:
    elem_00 = SchemaInfo::getTopLevelComponent
                        (this_00,6,(XMLCh *)SchemaSymbols::fgELT_NOTATION,name,&this->fSchemaInfo);
    if (elem_00 != (DOMElement *)0x0) {
      pXVar4 = traverseNotationDecl(this,elem_00);
      this->fSchemaInfo = pSVar1;
      this->fTargetNSURI = pSVar1->fTargetNSURI;
      goto LAB_0031c2a6;
    }
    reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x81,uriStr,name,(XMLCh *)0x0,
                      (XMLCh *)0x0);
LAB_0031c27c:
    pXVar4 = (XMLCh *)0x0;
  }
  else {
    namespaceURI = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[5])
                             (this->fURIStringPool,uriStr);
    bVar2 = isImportingNS(this,namespaceURI);
    if (!bVar2) {
      pXVar4 = (XMLCh *)0x0;
      reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x8e,uriStr,(XMLCh *)0x0,
                        (XMLCh *)0x0,(XMLCh *)0x0);
      goto LAB_0031c2a6;
    }
    pGVar5 = GrammarResolver::getGrammar(this->fGrammarResolver,uriStr);
    if (pGVar5 != (Grammar *)0x0) {
      iVar3 = (*(pGVar5->super_XSerializable)._vptr_XSerializable[5])(pGVar5);
      if (iVar3 == 1) {
        this_00 = SchemaInfo::getImportInfo(this->fSchemaInfo,namespaceURI);
        if ((this_00 != (SchemaInfo *)0x0) && (this_00->fProcessed != true)) {
          this->fSchemaInfo = this_00;
          this->fTargetNSURI = this_00->fTargetNSURI;
          goto LAB_0031c160;
        }
        reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x28,uriStr,name,(XMLCh *)0x0,
                          (XMLCh *)0x0);
        goto LAB_0031c27c;
      }
    }
    pXVar4 = (XMLCh *)0x0;
    reportSchemaError(this,elem,(XMLCh *)XMLUni::fgValidityDomain,0x26,uriStr,(XMLCh *)0x0,
                      (XMLCh *)0x0,(XMLCh *)0x0);
  }
LAB_0031c2a6:
  NamespaceScopeManager::~NamespaceScopeManager(&nsMgr);
  return pXVar4;
}

Assistant:

const XMLCh* TraverseSchema::traverseNotationDecl(const DOMElement* const elem,
                                                  const XMLCh* const name,
                                                  const XMLCh* const uriStr) {

    NamespaceScopeManager nsMgr(elem, fSchemaInfo, this);

    unsigned int uriId = fURIStringPool->addOrFind(uriStr);
    SchemaInfo*  saveInfo = fSchemaInfo;

    if (fTargetNSURI != (int) uriId) {

        // Make sure that we have an explicit import statement.
        // Clause 4 of Schema Representation Constraint:
        // http://www.w3.org/TR/xmlschema-1/#src-resolve
        unsigned int uriId = fURIStringPool->addOrFind(uriStr);

        if (!isImportingNS(uriId)) {

            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::InvalidNSReference, uriStr);
            return 0;
        }

        Grammar* grammar = fGrammarResolver->getGrammar(uriStr);

        if (grammar == 0 || grammar->getGrammarType() != Grammar::SchemaGrammarType) {

            reportSchemaError(elem, XMLUni::fgValidityDomain, XMLValid::GrammarNotFound, uriStr);
            return 0;
        }

        SchemaInfo* impInfo = fSchemaInfo->getImportInfo(uriId);

        if (!impInfo || impInfo->getProcessed()) {

            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::TypeNotFound, uriStr, name);
            return 0;
        }

        fSchemaInfo = impInfo;
        fTargetNSURI = fSchemaInfo->getTargetNSURI();
    }

    DOMElement* notationElem = fSchemaInfo->getTopLevelComponent(SchemaInfo::C_Notation,
        SchemaSymbols::fgELT_NOTATION, name, &fSchemaInfo);

    if (notationElem == 0) {

        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::Notation_DeclNotFound, uriStr, name);
        return 0;
    }

    const XMLCh* notationName = traverseNotationDecl(notationElem);

    fSchemaInfo = saveInfo;
    fTargetNSURI = fSchemaInfo->getTargetNSURI();

    return notationName;
}